

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O1

void Abc_NtkRetimeInsertLatchValues(Abc_Ntk_t *pNtk,Vec_Int_t *vValues)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  long lVar6;
  
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar2 = 0;
    iVar3 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar2];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8)) {
        lVar6 = (long)iVar3;
        iVar3 = iVar3 + 1;
        *(long *)((long)pvVar1 + 0x40) = lVar6;
      }
      lVar2 = lVar2 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar2 < pVVar4->nSize);
  }
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar2 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar2];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8)) {
        if (vValues == (Vec_Int_t *)0x0) {
          lVar6 = 3;
        }
        else {
          uVar5 = (uint)*(undefined8 *)((long)pvVar1 + 0x40);
          if (((int)uVar5 < 0) || (vValues->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar6 = 2 - (ulong)(vValues->pArray[uVar5 & 0x7fffffff] == 0);
        }
        *(long *)((long)pvVar1 + 0x38) = lVar6;
      }
      lVar2 = lVar2 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar2 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkRetimeInsertLatchValues( Abc_Ntk_t * pNtk, Vec_Int_t * vValues )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Counter++;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pData = (Abc_Obj_t *)(ABC_PTRUINT_T)(vValues? (Vec_IntEntry(vValues,(int)(ABC_PTRUINT_T)pObj->pCopy)? ABC_INIT_ONE : ABC_INIT_ZERO) : ABC_INIT_DC);
}